

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void write_vec_element(DisasContext_conflict1 *s,TCGv_i64 tcg_src,int destidx,int element,
                      MemOp memop)

{
  TCGContext_conflict1 *tcg_ctx;
  
  if (memop < MO_ASHIFT) {
    tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(tcg_ctx,memop + (MO_ALIGN_16|MO_BEUL),(TCGArg)(tcg_src + (long)tcg_ctx),
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                        (long)((element << ((byte)memop & 0x1f)) + destidx * 0x100 + 0xc10));
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
             ,0x44c,(char *)0x0);
}

Assistant:

static void write_vec_element(DisasContext *s, TCGv_i64 tcg_src, int destidx,
                              int element, MemOp memop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int vect_off = vec_reg_offset(s, destidx, element, memop & MO_SIZE);
    switch (memop) {
    case MO_8:
        tcg_gen_st8_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_16:
        tcg_gen_st16_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_32:
        tcg_gen_st32_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_64:
        tcg_gen_st_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    default:
        g_assert_not_reached();
    }
}